

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

ctmbstr prvTidytmbsubstr(ctmbstr s1,ctmbstr s2)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  lVar3 = 0;
  if ((s1 != (ctmbstr)0x0) && (lVar3 = 0, *s1 != '\0')) {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (s1[lVar1] != '\0');
  }
  if ((s2 != (ctmbstr)0x0) && (*s2 != '\0')) {
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (s2[lVar1] != '\0');
  }
  iVar2 = (int)lVar3 - (uint)lVar5;
  if (-1 < iVar2) {
    uVar4 = (ulong)(iVar2 + 1);
    do {
      iVar2 = prvTidytmbstrncasecmp(s1,s2,(uint)lVar5);
      if (iVar2 == 0) {
        return s1;
      }
      s1 = s1 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (ctmbstr)0x0;
}

Assistant:

ctmbstr TY_(tmbsubstr)( ctmbstr s1, ctmbstr s2 )
{
    uint len1 = TY_(tmbstrlen)(s1), len2 = TY_(tmbstrlen)(s2);
    int ix, diff = len1 - len2;

    for ( ix = 0; ix <= diff; ++ix )
    {
        if ( TY_(tmbstrncasecmp)(s1+ix, s2, len2) == 0 )
            return (ctmbstr) s1+ix;
    }
    return NULL;
}